

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamToolsIndex_p.cpp
# Opt level: O0

bool __thiscall
BamTools::Internal::BamToolsIndex::Jump
          (BamToolsIndex *this,BamRegion *region,bool *hasAlignmentsInRegion)

{
  int iVar1;
  bool bVar2;
  const_reference pvVar3;
  undefined1 *in_RDX;
  long in_RSI;
  long in_RDI;
  bool *in_stack_00000018;
  int64_t *in_stack_00000020;
  BamReaderPrivate *in_stack_00000028;
  BamException *e;
  int64_t offset;
  RefVector *references;
  size_type in_stack_fffffffffffffee8;
  allocator *paVar4;
  vector<BamTools::RefData,_std::allocator<BamTools::RefData>_> *in_stack_fffffffffffffef0;
  allocator local_d1;
  string local_d0 [16];
  string *in_stack_ffffffffffffff40;
  string *in_stack_ffffffffffffff48;
  BamIndex *in_stack_ffffffffffffff50;
  string local_a8 [32];
  RefVector *local_88;
  allocator local_79;
  string local_78 [55];
  allocator local_41;
  string local_40 [40];
  long local_18;
  
  *in_RDX = 0;
  if ((*(long *)(in_RDI + 8) != 0) &&
     (local_18 = in_RSI, bVar2 = BamReaderPrivate::IsOpen((BamReaderPrivate *)0x1c5c9c), bVar2)) {
    local_88 = BamReaderPrivate::GetReferenceData(*(BamReaderPrivate **)(in_RDI + 8));
    iVar1 = *(int *)(local_18 + 4);
    pvVar3 = std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>::at
                       (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
    if (pvVar3->RefLength < iVar1) {
      paVar4 = (allocator *)&stack0xffffffffffffff57;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a8,"BamToolsIndex::Jump",paVar4);
      paVar4 = &local_d1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_d0,"could not create index: invalid region requested",paVar4);
      BamIndex::SetErrorString
                (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
      std::__cxx11::string::~string(local_d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_d1);
      std::__cxx11::string::~string(local_a8);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff57);
      return false;
    }
    GetOffset((BamToolsIndex *)e,(BamRegion *)in_stack_00000028,in_stack_00000020,in_stack_00000018)
    ;
    bVar2 = BamReaderPrivate::Seek(in_stack_00000028,in_stack_00000020);
    return bVar2;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"BamToolsIndex::Jump",&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"could not jump: reader is not open",&local_79);
  BamIndex::SetErrorString
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  return false;
}

Assistant:

bool BamToolsIndex::Jump(const BamTools::BamRegion& region, bool* hasAlignmentsInRegion) {

    // clear flag
    *hasAlignmentsInRegion = false;

    // skip if invalid reader or not open
    if ( m_reader == 0 || !m_reader->IsOpen() ) {
        SetErrorString("BamToolsIndex::Jump", "could not jump: reader is not open");
        return false;
    }

    // make sure left-bound position is valid
    const RefVector& references = m_reader->GetReferenceData();
    if ( region.LeftPosition > references.at(region.LeftRefID).RefLength ) {
        SetErrorString("BamToolsIndex::Jump", "could not create index: invalid region requested");
        return false;
    }

    // calculate nearest offset to jump to
    int64_t offset;
    try {
        GetOffset(region, offset, hasAlignmentsInRegion);
    } catch ( BamException& e ) {
        m_errorString = e.what();
        return false;
    }

    // return success/failure of seek
    return m_reader->Seek(offset);
}